

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O2

bool __thiscall IntView<3>::remVal(IntView<3> *this,int64_t v,Reason r,bool channel)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  if (v % (long)this->a != 0) {
    return true;
  }
  UNRECOVERED_JUMPTABLE = (this->var->super_Var).super_Branching._vptr_Branching[0x11];
  iVar1 = (*UNRECOVERED_JUMPTABLE)
                    (this->var,-(v / (long)this->a),r.field_0,(ulong)channel,r.field_0,
                     UNRECOVERED_JUMPTABLE);
  return SUB41(iVar1,0);
}

Assistant:

bool remVal(int64_t v, Reason r = nullptr, bool channel = true) const {
		if ((type & 4) != 0) {
			v -= b;
		}
		if ((type & 2) != 0) {
			if ((v % a) != 0) {
				return true;
			}
			v = v / a;
		}
		if ((type & 1) != 0) {
			v = -v;
		}
		return var->remVal(v, r, channel);
	}